

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_1b15ef1::NotInProjectDir::operator()(NotInProjectDir *this,string *p)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  cmCMakePath path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  path local_98;
  path local_70;
  path local_48;
  
  pcVar1 = (p->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,pcVar1,pcVar1 + p->_M_string_length)
  ;
  cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
            ((cmCMakePath *)&local_98,&local_b8,generic_format);
  cmCMakePath::Normal((cmCMakePath *)&local_70,(cmCMakePath *)&local_98);
  std::filesystem::__cxx11::path::~path(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  cVar2 = std::filesystem::__cxx11::path::has_root_directory();
  if (cVar2 == '\0') {
    bVar4 = false;
  }
  else {
    cmCMakePath::cmCMakePath((cmCMakePath *)&local_98,this->SourceDir,generic_format);
    bVar3 = cmCMakePath::IsPrefix((cmCMakePath *)&local_98,(cmCMakePath *)&local_70);
    bVar4 = true;
    if (!bVar3) {
      cmCMakePath::cmCMakePath((cmCMakePath *)&local_48,this->BinaryDir,generic_format);
      bVar4 = cmCMakePath::IsPrefix((cmCMakePath *)&local_48,(cmCMakePath *)&local_70);
      std::filesystem::__cxx11::path::~path(&local_48);
    }
    bVar4 = (bool)(bVar4 ^ 1);
    std::filesystem::__cxx11::path::~path(&local_98);
  }
  std::filesystem::__cxx11::path::~path(&local_70);
  return bVar4;
}

Assistant:

bool operator()(const std::string& p) const
  {
    auto path = cmCMakePath(p).Normal();

    // Keep all relative paths:
    if (path.IsRelative()) {
      return false;
    }

    // If it's an absolute path, check if it starts with the source
    // directory:
    return !(cmCMakePath(this->SourceDir).IsPrefix(path) ||
             cmCMakePath(this->BinaryDir).IsPrefix(path));
  }